

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpt.cpp
# Opt level: O2

void __thiscall
pg::QPTSolver::updateState
          (QPTSolver *this,unsigned_long *_n0,unsigned_long *_n1,int *_max0,int *_max1,int *_k0,
          int *_k1)

{
  uint uVar1;
  Game *pGVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  unsigned_long uVar6;
  uint uVar7;
  unsigned_long uVar8;
  ulong uVar9;
  
  pGVar2 = (this->super_Solver).game;
  uVar3 = pGVar2->n_vertices;
  uVar7 = 0xffffffff;
  uVar9 = 0;
  uVar8 = 0;
  uVar5 = 0xffffffff;
  uVar6 = 0;
  while( true ) {
    if ((~((long)uVar3 >> 0x3f) & uVar3) == uVar9) break;
    if ((((this->super_Solver).disabled)->_bits[uVar9 >> 6] >> (uVar9 & 0x3f) & 1) == 0) {
      uVar1 = pGVar2->_priority[uVar9];
      if ((uVar1 & 1) == 0) {
        if ((int)uVar7 < (int)uVar1) {
          uVar7 = uVar1;
        }
        uVar6 = uVar6 + 1;
      }
      else {
        if ((int)uVar5 < (int)uVar1) {
          uVar5 = uVar1;
        }
        uVar8 = uVar8 + 1;
      }
    }
    uVar9 = uVar9 + 1;
  }
  *_n0 = uVar6;
  *_n1 = uVar8;
  *_max0 = uVar7;
  *_max1 = uVar5;
  iVar4 = ceil_log2(uVar6 + 1);
  *_k0 = iVar4 + 1;
  iVar4 = ceil_log2(uVar8 + 1);
  *_k1 = iVar4 + 1;
  return;
}

Assistant:

void
QPTSolver::updateState(unsigned long &_n0, unsigned long &_n1, int &_max0, int &_max1, int &_k0, int &_k1)
{
    // determine number of even/odd vertices and highest even/odd priority
    unsigned long n0 = 0;
    unsigned long n1 = 0;
    int max0 = -1;
    int max1 = -1;

    for (int i=0; i<nodecount(); i++) {
        if (disabled[i]) continue;
        const int pr = priority(i);
        if ((pr&1) == 0) {
            if (pr > max0) max0 = pr;
            n0++;
        } else {
            if (pr > max1) max1 = pr;
            n1++;
        }
    }

    _n0 = n0;
    _n1 = n1;
    _max0 = max0;
    _max1 = max1;

    _k0 = 1+ceil_log2(n0+1);
    _k1 = 1+ceil_log2(n1+1);
}